

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tlsio_openssl.c
# Opt level: O3

void on_underlying_io_open_complete(void *context,IO_OPEN_RESULT open_result)

{
  LOGGER_LOG UNRECOVERED_JUMPTABLE;
  
  if (*(int *)((long)context + 0x68) != 1) {
    UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
    if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
      (*UNRECOVERED_JUMPTABLE)
                (AZ_LOG_ERROR,
                 "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
                 ,"on_underlying_io_open_complete",0x35c,1,
                 "Invalid tlsio_state. Expected state is TLSIO_STATE_OPENING_UNDERLYING_IO.");
      return;
    }
    return;
  }
  if (open_result == IO_OPEN_OK) {
    *(undefined4 *)((long)context + 0x68) = 2;
    send_handshake_bytes((TLS_IO_INSTANCE *)context);
    return;
  }
  UNRECOVERED_JUMPTABLE = xlogging_get_log_function();
  if (UNRECOVERED_JUMPTABLE != (LOGGER_LOG)0x0) {
    (*UNRECOVERED_JUMPTABLE)
              (AZ_LOG_ERROR,
               "/workspace/llm4binary/github/license_c_cmakelists/Azure[P]azure-uamqp-c/deps/azure-c-shared-utility/adapters/tlsio_openssl.c"
               ,"on_underlying_io_open_complete",0x355,1,
               "Invalid open_result. Expected result is IO_OPEN_OK.");
  }
  *(undefined4 *)((long)context + 0x68) = 0;
  indicate_open_complete((TLS_IO_INSTANCE *)context,IO_OPEN_ERROR);
  return;
}

Assistant:

static void on_underlying_io_open_complete(void* context, IO_OPEN_RESULT open_result)
{
    TLS_IO_INSTANCE* tls_io_instance = (TLS_IO_INSTANCE*)context;

    if (tls_io_instance->tlsio_state == TLSIO_STATE_OPENING_UNDERLYING_IO)
    {
        if (open_result == IO_OPEN_OK)
        {
            tls_io_instance->tlsio_state = TLSIO_STATE_IN_HANDSHAKE;

            // Begin the handshake process here. It continues in on_underlying_io_bytes_received
            send_handshake_bytes(tls_io_instance);
        }
        else
        {
            LogError("Invalid open_result. Expected result is IO_OPEN_OK.");
            tls_io_instance->tlsio_state = TLSIO_STATE_NOT_OPEN;
            indicate_open_complete(tls_io_instance, IO_OPEN_ERROR);
        }
    }
    else
    {
        LogError("Invalid tlsio_state. Expected state is TLSIO_STATE_OPENING_UNDERLYING_IO.");
    }
}